

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O2

int32_t uprv_asciiFromEbcdic_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UErrorCode UVar1;
  ulong uVar2;
  int32_t iVar3;
  int32_t iVar4;
  byte bVar5;
  
  iVar3 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar3 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       (length != 0 && outData == (void *)0x0)) {
LAB_0029be26:
      *pErrorCode = UVar1;
      iVar3 = 0;
    }
    else {
      uVar2 = 0;
      for (iVar4 = length; iVar3 = length, 0 < iVar4; iVar4 = iVar4 + -1) {
        if ((ulong)*(byte *)((long)inData + uVar2) == 0) {
          bVar5 = 0;
        }
        else {
          bVar5 = ""[*(byte *)((long)inData + uVar2)];
          if ((bVar5 == 0) || ((invariantChars[bVar5 >> 5] >> (bVar5 & 0x1f) & 1) == 0)) {
            udata_printError_63(ds,
                                "uprv_asciiFromEbcdic() string[%d] contains a variant character in position %d\n"
                                ,length,uVar2 & 0xffffffff);
            UVar1 = U_INVALID_CHAR_FOUND;
            goto LAB_0029be26;
          }
        }
        *(byte *)((long)outData + uVar2) = bVar5;
        uVar2 = uVar2 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

U_CFUNC int32_t
uprv_asciiFromEbcdic(const UDataSwapper *ds,
                     const void *inData, int32_t length, void *outData,
                     UErrorCode *pErrorCode) {
    const uint8_t *s;
    uint8_t *t;
    uint8_t c;

    int32_t count;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 ||  (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    s=(const uint8_t *)inData;
    t=(uint8_t *)outData;
    count=length;
    while(count>0) {
        c=*s++;
        if(c!=0 && ((c=asciiFromEbcdic[c])==0 || !UCHAR_IS_INVARIANT(c))) {
            udata_printError(ds, "uprv_asciiFromEbcdic() string[%d] contains a variant character in position %d\n",
                             length, length-count);
            *pErrorCode=U_INVALID_CHAR_FOUND;
            return 0;
        }
        *t++=c;
        --count;
    }

    return length;
}